

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ae0418::TNoContractionPropagator::visitSymbol
          (TNoContractionPropagator *this,TIntermSymbol *node)

{
  int iVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  undefined4 extraout_var;
  long lVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  TIntermSymbol *local_48;
  undefined1 local_40 [8];
  ObjectAccessChain new_precise_accesschain;
  TIntermSymbol *node_local;
  TNoContractionPropagator *this_local;
  
  new_precise_accesschain.field_2._8_8_ = node;
  sVar2 = std::
          unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(this->accesschain_mapping_,
                  (key_type *)((long)&new_precise_accesschain.field_2 + 8));
  if (sVar2 != 0) {
    local_48 = node;
    pmVar3 = std::
             unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(this->accesschain_mapping_,(key_type *)&local_48);
    std::__cxx11::string::string((string *)local_40,(string *)pmVar3);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::operator+(&local_68,'/',&this->remained_accesschain_);
      std::__cxx11::string::operator+=((string *)local_40,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])();
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))();
      *(ulong *)(lVar5 + 8) = *(ulong *)(lVar5 + 8) & 0xffffffefffffffff | 0x1000000000;
    }
    sVar6 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->added_precise_object_ids_,(key_type *)local_40);
    if (sVar6 == 0) {
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(this->precise_objects_,(value_type *)local_40);
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->added_precise_object_ids_,(value_type *)local_40);
    }
    std::__cxx11::string::~string((string *)local_40);
    return;
  }
  __assert_fail("accesschain_mapping_.count(node)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                ,0x2ef,
                "virtual void (anonymous namespace)::TNoContractionPropagator::visitSymbol(glslang::TIntermSymbol *)"
               );
}

Assistant:

void visitSymbol(glslang::TIntermSymbol* node) override
    {
        // Symbol nodes are object nodes and should always have an
        // access chain collected before matches with it.
        assert(accesschain_mapping_.count(node));
        ObjectAccessChain new_precise_accesschain = accesschain_mapping_.at(node);
        // If the unused access chain is empty, this symbol node should be
        // marked as 'precise'.  Otherwise, the unused access chain should be
        // appended to the symbol ID to build a new access chain which points to
        // the nested 'precise' object in this symbol object.
        if (remained_accesschain_.empty()) {
            node->getWritableType().getQualifier().noContraction = true;
        } else {
            new_precise_accesschain += ObjectAccesschainDelimiter + remained_accesschain_;
        }
        // Add the new 'precise' access chain to the work list and make sure we
        // don't visit it again.
        if (!added_precise_object_ids_.count(new_precise_accesschain)) {
            precise_objects_.insert(new_precise_accesschain);
            added_precise_object_ids_.insert(new_precise_accesschain);
        }
    }